

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O0

void __thiscall
btBoxBoxDetector::getClosestPoints
          (btBoxBoxDetector *this,ClosestPointInput *input,Result *output,btIDebugDraw *param_4,
          bool param_5)

{
  btMatrix3x3 *pbVar1;
  btVector3 *pbVar2;
  btScalar *pbVar3;
  btTransform *in_RSI;
  byte in_R8B;
  int maxc;
  int return_code;
  btScalar depth;
  btVector3 normal;
  int j;
  dMatrix3 R2;
  dMatrix3 R1;
  dContactGeom *contact;
  int skip;
  btTransform *transformB;
  btTransform *transformA;
  btVector3 *in_stack_000004b0;
  btScalar *in_stack_000004b8;
  btVector3 *in_stack_000004c0;
  btVector3 *in_stack_000004c8;
  btScalar *in_stack_000004d0;
  btVector3 *in_stack_000004d8;
  btVector3 *in_stack_000004f0;
  btScalar *in_stack_000004f8;
  int *in_stack_00000500;
  int in_stack_00000508;
  dContactGeom *in_stack_00000510;
  int in_stack_00000518;
  Result *in_stack_00000520;
  btVector3 *in_stack_fffffffffffffe68;
  btScalar *in_stack_fffffffffffffe70;
  btBoxShape *in_stack_fffffffffffffe98;
  btVector3 local_dc;
  int local_cc;
  btScalar local_c8 [12];
  btScalar local_98 [12];
  undefined8 local_68;
  undefined4 local_5c;
  btTransform *local_58;
  btTransform *local_50;
  byte local_41;
  
  local_41 = in_R8B & 1;
  local_58 = in_RSI + 1;
  local_5c = 0;
  local_68 = 0;
  local_50 = in_RSI;
  for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
    pbVar1 = btTransform::getBasis(local_50);
    pbVar2 = btMatrix3x3::operator[](pbVar1,local_cc);
    pbVar3 = btVector3::x(pbVar2);
    local_98[local_cc << 2] = *pbVar3;
    pbVar1 = btTransform::getBasis(local_58);
    pbVar2 = btMatrix3x3::operator[](pbVar1,local_cc);
    pbVar3 = btVector3::x(pbVar2);
    local_c8[local_cc << 2] = *pbVar3;
    pbVar1 = btTransform::getBasis(local_50);
    pbVar2 = btMatrix3x3::operator[](pbVar1,local_cc);
    pbVar3 = btVector3::y(pbVar2);
    local_98[local_cc * 4 + 1] = *pbVar3;
    pbVar1 = btTransform::getBasis(local_58);
    pbVar2 = btMatrix3x3::operator[](pbVar1,local_cc);
    pbVar3 = btVector3::y(pbVar2);
    local_c8[local_cc * 4 + 1] = *pbVar3;
    pbVar1 = btTransform::getBasis(local_50);
    pbVar2 = btMatrix3x3::operator[](pbVar1,local_cc);
    pbVar3 = btVector3::z(pbVar2);
    local_98[local_cc * 4 + 2] = *pbVar3;
    pbVar1 = btTransform::getBasis(local_58);
    pbVar2 = btMatrix3x3::operator[](pbVar1,local_cc);
    pbVar3 = btVector3::z(pbVar2);
    local_c8[local_cc * 4 + 2] = *pbVar3;
  }
  btVector3::btVector3(&local_dc);
  btTransform::getOrigin(local_50);
  btBoxShape::getHalfExtentsWithMargin(in_stack_fffffffffffffe98);
  ::operator*(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  btTransform::getOrigin(local_58);
  btBoxShape::getHalfExtentsWithMargin(in_stack_fffffffffffffe98);
  ::operator*(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  dBoxBox2(in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,in_stack_000004b8
           ,in_stack_000004b0,in_stack_000004f0,in_stack_000004f8,in_stack_00000500,
           in_stack_00000508,in_stack_00000510,in_stack_00000518,in_stack_00000520);
  return;
}

Assistant:

void	btBoxBoxDetector::getClosestPoints(const ClosestPointInput& input,Result& output,class btIDebugDraw* /*debugDraw*/,bool /*swapResults*/)
{
	
	const btTransform& transformA = input.m_transformA;
	const btTransform& transformB = input.m_transformB;
	
	int skip = 0;
	dContactGeom *contact = 0;

	dMatrix3 R1;
	dMatrix3 R2;

	for (int j=0;j<3;j++)
	{
		R1[0+4*j] = transformA.getBasis()[j].x();
		R2[0+4*j] = transformB.getBasis()[j].x();

		R1[1+4*j] = transformA.getBasis()[j].y();
		R2[1+4*j] = transformB.getBasis()[j].y();


		R1[2+4*j] = transformA.getBasis()[j].z();
		R2[2+4*j] = transformB.getBasis()[j].z();

	}

	

	btVector3 normal;
	btScalar depth;
	int return_code;
	int maxc = 4;


	dBoxBox2 (transformA.getOrigin(), 
	R1,
	2.f*m_box1->getHalfExtentsWithMargin(),
	transformB.getOrigin(),
	R2, 
	2.f*m_box2->getHalfExtentsWithMargin(),
	normal, &depth, &return_code,
	maxc, contact, skip,
	output
	);

}